

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::setRange
          (MutableCodePointTrie *this,UChar32 start,UChar32 end,uint32_t value,UErrorCode *errorCode
          )

{
  uint32_t *puVar1;
  bool bVar2;
  uint uVar3;
  uint32_t *puVar4;
  UErrorCode UVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  uVar9 = (ulong)(uint)start;
  UVar5 = U_ILLEGAL_ARGUMENT_ERROR;
  if (((end < start) || (0x10ffff < (uint)start)) || (0x10ffff < (uint)end)) goto LAB_001c138e;
  bVar2 = ensureHighStart(this,end);
  UVar5 = U_MEMORY_ALLOCATION_ERROR;
  if (!bVar2) goto LAB_001c138e;
  uVar8 = end + 1;
  uVar10 = start & 0xf;
  if (uVar10 != 0) {
    uVar3 = getDataBlock(this,(uint)start >> 4);
    if ((int)uVar3 < 0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
LAB_001c12d4:
      bVar2 = false;
    }
    else {
      uVar6 = start + 0xfU & 0x3ffff0;
      puVar1 = this->data;
      if ((int)uVar8 < (int)uVar6) {
        if (uVar10 < (uVar8 & 0xf)) {
          puVar4 = puVar1 + (ulong)uVar3 + (ulong)uVar10;
          do {
            *puVar4 = value;
            puVar4 = puVar4 + 1;
          } while (puVar4 < puVar1 + (ulong)uVar3 + (ulong)(uVar8 & 0xf));
        }
        goto LAB_001c12d4;
      }
      uVar9 = (ulong)uVar10 * 4 - 4;
      do {
        *(uint32_t *)((long)puVar1 + uVar9 + (ulong)uVar3 * 4 + 4) = value;
        uVar9 = uVar9 + 4;
      } while (uVar9 < 0x3c);
      bVar2 = true;
      uVar9 = (ulong)uVar6;
    }
    if (!bVar2) {
      return;
    }
  }
  if ((int)uVar9 < (int)(uVar8 & 0x3ffff0)) {
    puVar1 = this->index;
    puVar4 = this->data;
    do {
      uVar7 = uVar9 >> 4;
      if (this->flags[uVar7] == '\0') {
        puVar1[uVar7] = value;
      }
      else {
        uVar10 = puVar1[uVar7];
        uVar7 = 0xfffffffffffffffc;
        do {
          *(uint32_t *)((long)puVar4 + uVar7 + (ulong)uVar10 * 4 + 4) = value;
          uVar7 = uVar7 + 4;
        } while (uVar7 < 0x3c);
      }
      uVar9 = uVar9 + 0x10;
    } while ((int)uVar9 < (int)(uVar8 & 0x3ffff0));
  }
  if ((uVar8 & 0xf) == 0) {
    return;
  }
  uVar10 = getDataBlock(this,(uint)(uVar9 >> 4) & 0xfffffff);
  UVar5 = U_MEMORY_ALLOCATION_ERROR;
  if (-1 < (int)uVar10) {
    puVar4 = this->data + uVar10;
    puVar1 = puVar4 + (uVar8 & 0xf);
    do {
      *puVar4 = value;
      puVar4 = puVar4 + 1;
    } while (puVar4 < puVar1);
    return;
  }
LAB_001c138e:
  *errorCode = UVar5;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }